

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

void resolve_when_ctx_snode(lys_node *schema,lys_node **ctx_snode,lyxp_node_type *ctx_snode_type)

{
  lys_module *module;
  lys_node *local_28;
  lys_node *sparent;
  lyxp_node_type *ctx_snode_type_local;
  lys_node **ctx_snode_local;
  lys_node *schema_local;
  
  *ctx_snode_type = LYXP_NODE_ELEM;
  ctx_snode_local = (lys_node **)schema;
  do {
    if (((ulong)ctx_snode_local[7] & 0x3642) == 0) {
LAB_0011b684:
      *ctx_snode = (lys_node *)ctx_snode_local;
      return;
    }
    if (*(int *)(ctx_snode_local + 7) == 0x2000) {
      local_28 = ctx_snode_local[0xb];
    }
    else {
      local_28 = ctx_snode_local[8];
    }
    if (local_28 == (lys_node *)0x0) {
      if (((ulong)ctx_snode_local[3] & 1) == 0) {
        *ctx_snode_type = LYXP_NODE_ROOT;
      }
      else {
        *ctx_snode_type = LYXP_NODE_ROOT_CONFIG;
      }
      module = lys_node_module((lys_node *)ctx_snode_local);
      ctx_snode_local = (lys_node **)lys_getnext((lys_node *)0x0,(lys_node *)0x0,module,0);
      goto LAB_0011b684;
    }
    ctx_snode_local = (lys_node **)local_28;
  } while( true );
}

Assistant:

void
resolve_when_ctx_snode(const struct lys_node *schema, struct lys_node **ctx_snode, enum lyxp_node_type *ctx_snode_type)
{
    const struct lys_node *sparent;

    /* find a not schema-only node */
    *ctx_snode_type = LYXP_NODE_ELEM;
    while (schema->nodetype & (LYS_USES | LYS_CHOICE | LYS_CASE | LYS_AUGMENT | LYS_INPUT | LYS_OUTPUT)) {
        if (schema->nodetype == LYS_AUGMENT) {
            sparent = ((struct lys_node_augment *)schema)->target;
        } else {
            sparent = schema->parent;
        }
        if (!sparent) {
            /* context node is the document root (fake root in our case) */
            if (schema->flags & LYS_CONFIG_W) {
                *ctx_snode_type = LYXP_NODE_ROOT_CONFIG;
            } else {
                *ctx_snode_type = LYXP_NODE_ROOT;
            }
            /* we need the first top-level sibling, but no uses or groupings */
            schema = lys_getnext(NULL, NULL, lys_node_module(schema), 0);
            break;
        }
        schema = sparent;
    }

    *ctx_snode = (struct lys_node *)schema;
}